

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::MakeDirectory(string *path)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  string local_90 [32];
  undefined1 local_70 [8];
  string topdir;
  size_type pos;
  undefined1 local_38 [8];
  string dir;
  string *path_local;
  
  dir.field_2._8_8_ = path;
  bVar1 = FileExists(path);
  if (bVar1) {
    path_local._7_1_ = FileIsDirectory((string *)dir.field_2._8_8_);
  }
  else {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::__cxx11::string::string((string *)local_38,(string *)dir.field_2._8_8_);
      ConvertToUnixSlashes((string *)local_38);
      topdir.field_2._8_8_ = 0;
      std::__cxx11::string::string((string *)local_70);
      while (topdir.field_2._8_8_ = std::__cxx11::string::find((char)local_38,0x2f),
            topdir.field_2._8_8_ != -1) {
        std::__cxx11::string::substr((ulong)local_90,(ulong)local_38);
        std::__cxx11::string::operator=((string *)local_70,local_90);
        std::__cxx11::string::~string(local_90);
        Mkdir((string *)local_70);
        topdir.field_2._8_8_ = topdir.field_2._8_8_ + 1;
      }
      std::__cxx11::string::operator=((string *)local_70,(string *)local_38);
      iVar2 = Mkdir((string *)local_70);
      if ((iVar2 == 0) || (piVar4 = __errno_location(), *piVar4 == 0x11)) {
        path_local._7_1_ = true;
      }
      else {
        path_local._7_1_ = false;
      }
      std::__cxx11::string::~string((string *)local_70);
      std::__cxx11::string::~string((string *)local_38);
    }
    else {
      path_local._7_1_ = false;
    }
  }
  return path_local._7_1_;
}

Assistant:

bool SystemTools::MakeDirectory(const std::string& path)
{
  if(SystemTools::FileExists(path))
    {
    return SystemTools::FileIsDirectory(path);
    }
  if(path.empty())
    {
    return false;
    }
  std::string dir = path;
  SystemTools::ConvertToUnixSlashes(dir);

  std::string::size_type pos = 0;
  std::string topdir;
  while((pos = dir.find('/', pos)) != std::string::npos)
    {
    topdir = dir.substr(0, pos);
    Mkdir(topdir);
    pos++;
    }
  topdir = dir;
  if(Mkdir(topdir) != 0)
    {
    // There is a bug in the Borland Run time library which makes MKDIR
    // return EACCES when it should return EEXISTS
    // if it is some other error besides directory exists
    // then return false
    if( (errno != EEXIST)
#ifdef __BORLANDC__
        && (errno != EACCES)
#endif
      )
      {
      return false;
      }
    }
  return true;
}